

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O0

void __thiscall OPLmusicBlock::ResetChips(OPLmusicBlock *this)

{
  OPLio *pOVar1;
  int iVar2;
  uint uVar3;
  OPLmusicBlock *this_local;
  
  FCriticalSection::Enter(&this->ChipAccess);
  (*((this->super_musicBlock).io)->_vptr_OPLio[3])();
  pOVar1 = (this->super_musicBlock).io;
  iVar2 = FIntCVar::operator*(&opl_numchips);
  uVar3 = MIN<int>(iVar2,2);
  iVar2 = (*pOVar1->_vptr_OPLio[2])(pOVar1,(ulong)uVar3,(ulong)(this->FullPan & 1),0);
  this->NumChips = iVar2;
  FCriticalSection::Leave(&this->ChipAccess);
  return;
}

Assistant:

void OPLmusicBlock::ResetChips ()
{
	ChipAccess.Enter();
	io->OPLdeinit ();
	NumChips = io->OPLinit(MIN(*opl_numchips, 2), FullPan);
	ChipAccess.Leave();
}